

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

bool __thiscall NJamSpell::TSpellCorrector::LoadCache(TSpellCorrector *this,string *cacheFile)

{
  uint64_t uVar1;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> uVar2;
  char cVar3;
  uint64_t uVar4;
  TBloomFilter *this_00;
  __uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
  this_01;
  bool bVar5;
  istream local_250 [8];
  ifstream in;
  uint64_t local_48;
  uint64_t checkSum;
  uint64_t magicByte;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> deletes1;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> deletes2;
  uint16_t version;
  
  std::ifstream::ifstream(local_250,(string *)cacheFile,_S_bin);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    deletes2._M_t.
    super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>.
    _M_t.
    super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
    .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl._6_2_ = 0;
    checkSum = 0;
    std::istream::read((char *)local_250,(long)&checkSum);
    if (checkSum == 0x34e5602a26004436) {
      std::istream::read((char *)local_250,
                         (long)((long)&deletes2._M_t.
                                       super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                                       .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>.
                                       _M_head_impl + 6));
      if (deletes2._M_t.
          super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
          .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl._6_2_ == 1) {
        local_48 = 0;
        std::istream::read((char *)local_250,(long)&local_48);
        uVar1 = local_48;
        uVar4 = TLangModel::GetCheckSum(&this->LangModel);
        if (uVar1 == uVar4) {
          this_00 = (TBloomFilter *)operator_new(8);
          TBloomFilter::TBloomFilter(this_00);
          magicByte = (uint64_t)this_00;
          this_01.
          super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
          .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
               (__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                )operator_new(8);
          TBloomFilter::TBloomFilter
                    ((TBloomFilter *)
                     this_01.
                     super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                     .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl);
          deletes1._M_t.
          super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
          .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
               (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
                )(__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
                  )this_01.
                   super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                   .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl;
          TBloomFilter::Load((TBloomFilter *)magicByte,local_250);
          TBloomFilter::Load((TBloomFilter *)
                             deletes1._M_t.
                             super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                             .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl,
                             local_250);
          checkSum = 0;
          std::istream::read((char *)local_250,(long)&checkSum);
          uVar1 = magicByte;
          bVar5 = checkSum == 0x34e5602a26004436;
          if (bVar5) {
            magicByte = 0;
            std::
            __uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ::reset((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                     *)&this->Deletes1,(pointer)uVar1);
            uVar2 = deletes1;
            deletes1._M_t.
            super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ._M_t.
            super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
            .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
                  )(__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                    )0x0;
            std::
            __uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ::reset((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                     *)&this->Deletes2,
                    (pointer)uVar2._M_t.
                             super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                             .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl);
          }
          uVar2._M_t.
          super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
          .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
               deletes1._M_t.
               super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
               ._M_t.
               super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
               .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl;
          if ((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
               )deletes1._M_t.
                super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                ._M_t.
                super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
               )0x0) {
            TBloomFilter::~TBloomFilter
                      ((TBloomFilter *)
                       deletes1._M_t.
                       super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                       .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl);
            operator_delete((void *)uVar2._M_t.
                                    super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                                    .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>.
                                    _M_head_impl);
          }
          uVar1 = magicByte;
          if (magicByte != 0) {
            TBloomFilter::~TBloomFilter((TBloomFilter *)magicByte);
            operator_delete((void *)uVar1);
          }
          goto LAB_0010874e;
        }
      }
    }
  }
  bVar5 = false;
LAB_0010874e:
  std::ifstream::~ifstream(local_250);
  return bVar5;
}

Assistant:

bool TSpellCorrector::LoadCache(const std::string& cacheFile) {
    std::ifstream in(cacheFile, std::ios::binary);
    if (!in.is_open()) {
        return false;
    }
    uint16_t version = 0;
    uint64_t magicByte = 0;
    NHandyPack::Load(in, magicByte);
    if (magicByte != SPELL_CHECKER_CACHE_MAGIC_BYTE) {
        return false;
    }
    NHandyPack::Load(in, version);
    if (version != SPELL_CHECKER_CACHE_VERSION) {
        return false;
    }
    uint64_t checkSum = 0;
    NHandyPack::Load(in, checkSum);
    if (checkSum != LangModel.GetCheckSum()) {
        return false;
    }
    std::unique_ptr<TBloomFilter> deletes1(new TBloomFilter());
    std::unique_ptr<TBloomFilter> deletes2(new TBloomFilter());
    deletes1->Load(in);
    deletes2->Load(in);
    magicByte = 0;
    NHandyPack::Load(in, magicByte);
    if (magicByte != SPELL_CHECKER_CACHE_MAGIC_BYTE) {
        return false;
    }
    Deletes1 = std::move(deletes1);
    Deletes2 = std::move(deletes2);
    return true;
}